

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

int asciiToAscii(uchar *out,int *poutlen,uchar *in,int *pinlen,void *vctxt)

{
  uchar uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  if (in == (uchar *)0x0) {
    *pinlen = 0;
    *poutlen = 0;
    return 0;
  }
  iVar2 = *pinlen;
  iVar3 = *poutlen;
  iVar4 = iVar3;
  if (iVar2 <= iVar3) {
    iVar4 = iVar2;
  }
  iVar5 = -3;
  if (iVar2 <= iVar3) {
    iVar5 = iVar2;
  }
  *poutlen = iVar4;
  *pinlen = iVar4;
  lVar6 = 0;
  while( true ) {
    if (in + iVar4 <= in + lVar6) {
      return iVar5;
    }
    uVar1 = in[lVar6];
    if ((char)uVar1 < '\0') break;
    out[lVar6] = uVar1;
    lVar6 = lVar6 + 1;
  }
  *poutlen = (int)lVar6;
  *pinlen = (int)lVar6;
  return -2;
}

Assistant:

static int
asciiToAscii(unsigned char* out, int *poutlen,
             const unsigned char* in, int *pinlen,
             void *vctxt ATTRIBUTE_UNUSED) {
    const unsigned char *inend;
    const unsigned char *instart = in;
    int inlen, outlen, ret;

    if (in == NULL) {
        *pinlen = 0;
        *poutlen = 0;
        return(XML_ENC_ERR_SUCCESS);
    }

    inlen = *pinlen;
    outlen = *poutlen;

    if (outlen < inlen) {
        inlen = outlen;
        ret = XML_ENC_ERR_SPACE;
    } else {
        ret = inlen;
    }

    inend = in + inlen;
    *poutlen = inlen;
    *pinlen = inlen;

    while (in < inend) {
	unsigned c = *in;

        if (c >= 0x80) {
	    *poutlen = in - instart;
	    *pinlen = in - instart;
	    return(XML_ENC_ERR_INPUT);
	}

        in++;
	*out++ = c;
    }

    return(ret);
}